

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

bool __thiscall position::is_draw(position *this)

{
  int local_28;
  int local_24;
  int idx;
  uint same_count;
  U64 kcurrent;
  position *this_local;
  
  if ((this->ifo).move50 < 100) {
    local_24 = 0;
    local_28 = (int)this->hidx;
    for (; local_28 = local_28 + -2, local_24 == 0 && -1 < local_28;
        local_24 = (uint)((this->ifo).repkey == this->history[local_28].repkey) + local_24) {
    }
    this_local._7_1_ = local_24 != 0;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool position::is_draw() {

	if (ifo.move50 > 99) 
		return true;

	U64 kcurrent = ifo.repkey;
	unsigned same_count = 0;
	int idx = hidx - 2;
	while (same_count == 0 && idx >= 0) {
		same_count += (kcurrent == history[idx].repkey);
		idx -= 2;
	}

	return same_count > 0;
}